

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  byte bVar1;
  ImGuiContext *pIVar2;
  short sVar3;
  int iVar4;
  ImGuiTableColumnFlags IVar5;
  char *pcVar6;
  ImGuiTableColumn *pIVar7;
  ImGuiTableColumn *pIVar8;
  byte *pbVar9;
  uint uVar10;
  ImU32 *in_RDI;
  bool bVar11;
  bool bVar12;
  float rhs;
  float fVar13;
  float fVar14;
  ImGuiWindow *inner_window;
  ImGuiID context_menu_id;
  float unused_x1;
  float initial_max_pos_x;
  float max_x;
  ImGuiTableColumn *column_3;
  int column_n_1;
  int order_n_3;
  ImRect host_clip_rect;
  float offset_x;
  int visible_n;
  bool is_hovering_table;
  ImRect mouse_hit_rect;
  ImGuiTableColumn *column_2;
  int order_n_2;
  ImGuiTableColumn *next_column;
  float weight_ratio;
  ImGuiTableColumn *column_1;
  int order_n_1;
  int count_resizable;
  float width_remaining_for_stretched_columns;
  float width_avail_for_stretched_columns;
  float width_avail;
  float width_spacings;
  int init_size;
  bool auto_fit;
  float column_width_ideal;
  float column_content_width_headers;
  float column_content_width_rows;
  ImGuiTableColumn *column;
  int column_n;
  int order_n;
  float sum_width_fixed_requests;
  float sum_weights_stretched;
  float min_column_width;
  float padding_auto_x;
  ImRect work_rect;
  ImGuiContext *g;
  byte bVar15;
  ImGuiTableColumnFlags in_stack_fffffffffffffecc;
  float in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffedc;
  ImGuiTable *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  ImDrawList *in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef8;
  undefined3 uVar16;
  float in_stack_fffffffffffffefc;
  ImGuiID id;
  ImGuiTable *in_stack_ffffffffffffff00;
  ImGuiTable *in_stack_ffffffffffffff10;
  float local_e4;
  float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  int local_c8;
  ulong local_c4;
  float local_b4;
  int local_b0;
  ImU32 local_8c;
  int local_6c;
  int local_68;
  float local_64;
  float local_5c;
  float local_4c;
  int iVar17;
  float fVar18;
  float fVar19;
  ImVec2 IVar20;
  
  pIVar2 = GImGui;
  if ((*(byte *)((long)in_RDI + 0x1d2) & 1) != 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x20ca,"TableUpdateLayout","ImGui ASSERT FAILED: %s",
                "table->IsLayoutLocked == false");
  }
  *(undefined1 *)((long)in_RDI + 0x1c2) = 0xff;
  *(undefined1 *)((long)in_RDI + 0x1c3) = 0xff;
  IVar20 = *(ImVec2 *)(in_RDI + 0x3d);
  fVar14 = (float)in_RDI[0x2f];
  rhs = TableGetMinColumnWidth();
  fVar19 = 0.0;
  fVar18 = 0.0;
  *(undefined1 *)((long)in_RDI + 0x1ca) = 0xff;
  in_RDI[0x36] = 0;
  for (iVar17 = 0; iVar17 < (int)in_RDI[0x1b]; iVar17 = iVar17 + 1) {
    if ((*(ulong *)(in_RDI + 0x14) & 1L << ((byte)iVar17 & 0x3f)) != 0) {
      pcVar6 = ImSpan<signed_char>::operator[]
                         ((ImSpan<signed_char> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc
                         );
      iVar4 = (int)*pcVar6;
      pIVar7 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)in_stack_fffffffffffffee0,
                          in_stack_fffffffffffffedc);
      IVar5 = TableFixColumnFlags((ImGuiTable *)
                                  CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                  in_stack_fffffffffffffecc);
      pIVar7->Flags = IVar5;
      if ((pIVar7->Flags & 0xc000U) == 0) {
        uVar10 = 0x8000;
        if (iVar4 == 0) {
          uVar10 = 0x4000;
        }
        pIVar7->Flags = uVar10 | pIVar7->Flags;
      }
      if ((in_RDI[1] & 8) != 0) {
        TableFixColumnSortDirection(pIVar7);
      }
      sVar3 = ImMax<short>(pIVar7->ContentWidthRowsFrozen,pIVar7->ContentWidthRowsUnfrozen);
      local_4c = (float)(int)sVar3;
      if (((in_RDI[1] & 0x20000) == 0) && ((pIVar7->Flags & 0x800U) == 0)) {
        local_4c = ImMax<float>(local_4c,(float)(int)pIVar7->ContentWidthHeadersIdeal);
      }
      local_4c = ImMax<float>(local_4c + fVar14,rhs);
      if ((((pIVar7->Flags & 4U) != 0) && (0.0 < pIVar7->WidthOrWeightInitValue)) &&
         (((in_RDI[1] & 1) == 0 || ((pIVar7->Flags & 0x20U) == 0)))) {
        local_4c = ImMax<float>(local_4c,pIVar7->WidthOrWeightInitValue);
      }
      in_RDI[0x36] = (ImU32)(local_4c + (float)in_RDI[0x36]);
      if (pIVar7->PrevVisibleColumn != -1) {
        in_RDI[0x36] = (ImU32)((float)in_RDI[0x31] + (float)in_RDI[0x36]);
      }
      if ((pIVar7->Flags & 0x14U) == 0) {
        if ((pIVar7->Flags & 8U) == 0) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                      ,0x2115,"TableUpdateLayout","ImGui ASSERT FAILED: %s",
                      "column->Flags & ImGuiTableColumnFlags_WidthStretch");
        }
        if (pIVar7->WidthStretchWeight <= 0.0 && pIVar7->WidthStretchWeight != 0.0) {
          pIVar7->WidthStretchWeight = 1.0;
        }
        fVar19 = pIVar7->WidthStretchWeight + fVar19;
        if (*(char *)((long)in_RDI + 0x1ca) == -1) {
          *(ImS8 *)((long)in_RDI + 0x1ca) = pIVar7->DisplayOrder;
        }
      }
      else {
        uVar16 = SUB43(in_stack_fffffffffffffefc,0);
        in_stack_fffffffffffffefc = (float)CONCAT13(1,uVar16);
        if (pIVar7->AutoFitQueue == '\0') {
          in_stack_fffffffffffffefc = (float)CONCAT13((pIVar7->Flags & 0x10U) != 0,uVar16);
        }
        if ((((char)((uint)in_stack_fffffffffffffefc >> 0x18) != '\0') &&
            (pIVar7->WidthRequest = local_4c, '\x01' < pIVar7->AutoFitQueue)) &&
           ((in_RDI[0x75] & 1) != 0)) {
          fVar13 = ImMax<float>(pIVar7->WidthRequest,rhs * 4.0);
          pIVar7->WidthRequest = fVar13;
        }
        fVar18 = pIVar7->WidthRequest + fVar18;
      }
    }
  }
  fVar14 = (float)in_RDI[0x31] * (float)(int)(in_RDI[0x1c] - 1);
  if ((((in_RDI[1] & 0x100000) == 0) || ((float)in_RDI[0x34] != 0.0)) || (NAN((float)in_RDI[0x34])))
  {
    local_5c = ImRect::GetWidth((ImRect *)&stack0xffffffffffffffe0);
  }
  else {
    local_5c = ImRect::GetWidth((ImRect *)(in_RDI + 0x41));
  }
  local_5c = local_5c - fVar14;
  local_68 = 0;
  in_RDI[0x35] = (ImU32)fVar14;
  local_64 = local_5c - fVar18;
  for (local_6c = 0; local_6c < (int)in_RDI[0x1b]; local_6c = local_6c + 1) {
    if ((*(ulong *)(in_RDI + 0x14) & 1L << ((byte)local_6c & 0x3f)) != 0) {
      in_stack_fffffffffffffef0 = (ImDrawList *)(in_RDI + 6);
      ImSpan<signed_char>::operator[]
                ((ImSpan<signed_char> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      pIVar7 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)in_stack_fffffffffffffee0,
                          in_stack_fffffffffffffedc);
      if ((pIVar7->Flags & 8U) != 0) {
        fVar14 = ImMax<float>((local_5c - fVar18) * (pIVar7->WidthStretchWeight / fVar19),rhs);
        pIVar7->WidthRequest = (float)(int)(fVar14 + 0.01);
        local_64 = local_64 - pIVar7->WidthRequest;
        if (((pIVar7->NextVisibleColumn != -1) &&
            (pIVar8 = ImSpan<ImGuiTableColumn>::operator[]
                                ((ImSpan<ImGuiTableColumn> *)in_stack_fffffffffffffee0,
                                 in_stack_fffffffffffffedc), pIVar8 != (ImGuiTableColumn *)0x0)) &&
           ((pIVar8->Flags & 4U) != 0)) {
          pIVar7->Flags = pIVar8->Flags & 0x100000U | pIVar7->Flags;
        }
      }
      if ((pIVar7->NextVisibleColumn == -1) && (*(char *)((long)in_RDI + 0x1ca) != -1)) {
        pIVar7->Flags = pIVar7->Flags | 0x100000;
      }
      if ((pIVar7->Flags & 0x20U) == 0) {
        local_68 = local_68 + 1;
      }
      fVar14 = ImMax<float>(pIVar7->WidthRequest,rhs);
      fVar14 = ImFloor(fVar14);
      pIVar7->WidthGiven = fVar14;
      in_RDI[0x35] = (ImU32)(pIVar7->WidthGiven + (float)in_RDI[0x35]);
    }
  }
  if (1.0 <= local_64) {
    local_8c = in_RDI[0x1b];
    while( true ) {
      local_8c = local_8c - 1;
      bVar12 = false;
      if ((0.0 < fVar19) && (bVar12 = false, 1.0 <= local_64)) {
        bVar12 = -1 < (int)local_8c;
      }
      if (!bVar12) break;
      if ((*(ulong *)(in_RDI + 0x14) & 1L << ((byte)local_8c & 0x3f)) != 0) {
        in_stack_fffffffffffffee0 = (ImGuiTable *)(in_RDI + 6);
        ImSpan<signed_char>::operator[]
                  ((ImSpan<signed_char> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
        pIVar7 = ImSpan<ImGuiTableColumn>::operator[]
                           ((ImSpan<ImGuiTableColumn> *)in_stack_fffffffffffffee0,
                            in_stack_fffffffffffffedc);
        if ((pIVar7->Flags & 8U) != 0) {
          pIVar7->WidthRequest = pIVar7->WidthRequest + 1.0;
          pIVar7->WidthGiven = pIVar7->WidthGiven + 1.0;
          local_64 = local_64 - 1.0;
        }
      }
    }
    in_stack_fffffffffffffeef = 0;
  }
  fVar14 = (float)in_RDI[0x39];
  fVar18 = (float)in_RDI[0x3a];
  fVar19 = (float)in_RDI[0x3b];
  ImMax<float>((float)in_RDI[0x3c],(float)in_RDI[0x3a] + (float)in_RDI[0x32]);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffee0,fVar14,fVar19,fVar18,in_stack_fffffffffffffed0)
  ;
  bVar12 = ItemHoverable((ImRect *)CONCAT44(fVar14,fVar19),(ImGuiID)fVar18);
  local_b0 = 0;
  if ((char)in_RDI[0x74] < '\x01') {
    local_b4 = IVar20.x;
  }
  else {
    local_b4 = (float)in_RDI[0x39];
  }
  local_c4 = *(ulong *)(in_RDI + 0x41);
  for (local_c8 = 0; local_c8 < (int)in_RDI[0x1b]; local_c8 = local_c8 + 1) {
    pbVar9 = (byte *)ImSpan<signed_char>::operator[]
                               ((ImSpan<signed_char> *)in_stack_fffffffffffffee0,(int)fVar14);
    bVar1 = *pbVar9;
    pIVar7 = ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)in_stack_fffffffffffffee0,(int)fVar14);
    if (('\0' < (char)in_RDI[0x74]) && ((char)in_RDI[0x74] == local_b0)) {
      local_b4 = (IVar20.x - (float)in_RDI[0x39]) + local_b4;
    }
    if ((*(ulong *)(in_RDI + 0x14) & 1L << ((byte)local_c8 & 0x3f)) == 0) {
      pIVar7->MaxX = local_b4;
      pIVar7->MinX = local_b4;
      pIVar7->StartXHeaders = local_b4;
      pIVar7->StartXRows = local_b4;
      pIVar7->WidthGiven = 0.0;
      (pIVar7->ClipRect).Min.x = local_b4;
      (pIVar7->ClipRect).Min.y = IVar20.y;
      (pIVar7->ClipRect).Max.x = local_b4;
      (pIVar7->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull
                ((ImRect *)in_stack_fffffffffffffef0,
                 (ImRect *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
      pIVar7->SkipItems = true;
      pIVar7->IsClipped = true;
    }
    else {
      in_stack_ffffffffffffff24 = 3.4028235e+38;
      if ((in_RDI[1] & 0x100000) == 0) {
        if ((in_RDI[1] & 0x80000) == 0) {
          in_stack_ffffffffffffff24 =
               -(float)(int)(in_RDI[0x1c] - (pIVar7->IndexWithinVisibleSet + 1)) * rhs +
               (float)in_RDI[0x3f];
        }
      }
      else if (local_c8 < *(char *)((long)in_RDI + 0x1cf)) {
        in_stack_ffffffffffffff24 =
             -(float)(*(char *)((long)in_RDI + 0x1cf) - local_c8) * rhs + (float)in_RDI[0x43];
      }
      if (in_stack_ffffffffffffff24 < local_b4 + pIVar7->WidthGiven) {
        fVar13 = ImMax<float>(in_stack_ffffffffffffff24 - local_b4,rhs);
        pIVar7->WidthGiven = fVar13;
      }
      pIVar7->MinX = local_b4;
      pIVar7->MaxX = pIVar7->MinX + pIVar7->WidthGiven;
      (pIVar7->ClipRect).Min.x = pIVar7->MinX;
      (pIVar7->ClipRect).Min.y = IVar20.y;
      (pIVar7->ClipRect).Max.x = pIVar7->MaxX;
      (pIVar7->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull
                ((ImRect *)in_stack_fffffffffffffef0,
                 (ImRect *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
      bVar11 = false;
      if (((pIVar7->ClipRect).Max.x <= (pIVar7->ClipRect).Min.x) &&
         (bVar11 = false, (pIVar7->AutoFitQueue & 1U) == 0)) {
        bVar11 = (pIVar7->CannotSkipItemsQueue & 1U) == 0;
      }
      pIVar7->IsClipped = bVar11;
      if ((pIVar7->IsClipped & 1U) != 0) {
        *(ulong *)(in_RDI + 0x16) =
             (1L << (bVar1 & 0x3f) ^ 0xffffffffffffffffU) & *(ulong *)(in_RDI + 0x16);
      }
      bVar15 = 1;
      if ((pIVar7->IsVisible & 1U) != 0) {
        bVar15 = *(byte *)((long)in_RDI + 0x1de);
      }
      pIVar7->SkipItems = (bool)(bVar15 & 1);
      if (((bVar12) && ((pIVar7->ClipRect).Min.x <= (pIVar2->IO).MousePos.x)) &&
         ((pIVar2->IO).MousePos.x < (pIVar7->ClipRect).Max.x)) {
        *(byte *)((long)in_RDI + 0x1c2) = bVar1;
      }
      fVar13 = pIVar7->MinX + (float)in_RDI[0x2e];
      pIVar7->StartXHeaders = fVar13;
      pIVar7->StartXRows = fVar13;
      in_stack_ffffffffffffff20 = pIVar7->MinX + (float)in_RDI[0x2e];
      pIVar7->ContentMaxPosRowsUnfrozen = in_stack_ffffffffffffff20;
      pIVar7->ContentMaxPosRowsFrozen = in_stack_ffffffffffffff20;
      pIVar7->ContentMaxPosHeadersIdeal = in_stack_ffffffffffffff20;
      pIVar7->ContentMaxPosHeadersUsed = in_stack_ffffffffffffff20;
      if ((*(byte *)((long)in_RDI + 0x1de) & 1) == 0) {
        pIVar7->AutoFitQueue = pIVar7->AutoFitQueue >> 1;
        pIVar7->CannotSkipItemsQueue = pIVar7->CannotSkipItemsQueue >> 1;
      }
      if (local_b0 < (char)in_RDI[0x74]) {
        fVar13 = ImMax<float>((float)local_c4,pIVar7->MaxX + 2.0);
        local_c4 = (ulong)(uint)fVar13;
      }
      local_b4 = pIVar7->WidthGiven + (float)in_RDI[0x31] + local_b4;
      local_b0 = local_b0 + 1;
    }
  }
  if ((bVar12) && (*(char *)((long)in_RDI + 0x1c2) == -1)) {
    local_e4 = (float)in_RDI[0x3d];
    if (*(char *)((long)in_RDI + 0x1c9) != -1) {
      pIVar7 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)in_stack_fffffffffffffee0,(int)fVar14);
      local_e4 = ImMax<float>(local_e4,(pIVar7->ClipRect).Max.x);
    }
    if (local_e4 <= (pIVar2->IO).MousePos.x) {
      *(char *)((long)in_RDI + 0x1c2) = (char)in_RDI[0x1b];
    }
  }
  if ((local_68 == 0) && ((in_RDI[1] & 1) != 0)) {
    in_RDI[1] = in_RDI[1] & 0xfffffffe;
  }
  TableUpdateDrawChannels(in_stack_ffffffffffffff00);
  id = (ImGuiID)in_stack_ffffffffffffff00;
  if ((in_RDI[1] & 1) != 0) {
    TableUpdateBorders(in_stack_ffffffffffffff10);
  }
  in_RDI[0x33] = 0;
  *(undefined1 *)((long)in_RDI + 0x1d2) = 1;
  *(undefined1 *)((long)in_RDI + 0x1d7) = 0;
  if (((in_RDI[0x76] & 1) != 0) && ((short)in_RDI[0x1f] == *(short *)((long)in_RDI + 0x7e))) {
    ImHashStr("##ContextMenu",0,*in_RDI);
    bVar12 = BeginPopupEx(id,(ImGuiWindowFlags)in_stack_fffffffffffffefc);
    if (bVar12) {
      TableDrawContextMenu
                ((ImGuiTable *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      EndPopup();
    }
    else {
      *(undefined1 *)(in_RDI + 0x76) = 0;
    }
  }
  if ((in_RDI[1] & 0x4000) == 0) {
    IVar20.y = in_stack_fffffffffffffefc;
    IVar20.x = in_stack_fffffffffffffef8;
    ImDrawList::PushClipRect
              (in_stack_fffffffffffffef0,*(ImVec2 *)(*(long *)(in_RDI + 0x5a) + 0x268),IVar20,
               (bool)in_stack_fffffffffffffeef);
  }
  else {
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)in_stack_fffffffffffffee0,(ImDrawList *)CONCAT44(fVar14,fVar19)
               ,(int)fVar18);
  }
  if (((*(byte *)((long)in_RDI + 0x1d5) & 1) != 0) && ((in_RDI[1] & 8) != 0)) {
    TableSortSpecsBuild(in_stack_fffffffffffffee0);
  }
  return;
}

Assistant:

void    ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;

    // Compute offset, clip rect for the frame
    // (can't make auto padding larger than what WorkRect knows about so right-alignment matches)
    const ImRect work_rect = table->WorkRect;
    const float padding_auto_x = table->CellPaddingX2;
    const float min_column_width = TableGetMinColumnWidth();

//    int count_fixed = 0;  -- set but never used
    float sum_weights_stretched = 0.0f;     // Sum of all weights for weighted columns.
    float sum_width_fixed_requests = 0.0f;  // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns.
    table->LeftMostStretchedColumnDisplayOrder = -1;
    table->ColumnsAutoFitWidth = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Adjust flags: default width mode + weighted columns are not allowed when auto extending
        // FIXME-TABLE: Clarify why we need to do this again here and not just in TableSetupColumn()
        column->Flags = TableFixColumnFlags(table, column->FlagsIn);
        if ((column->Flags & ImGuiTableColumnFlags_IndentMask_) == 0)
            column->Flags |= (column_n == 0) ? ImGuiTableColumnFlags_IndentEnable : ImGuiTableColumnFlags_IndentDisable;

        // We have a unusual edge case where if the user doesn't call TableGetSortSpecs() but has sorting enabled
        // or varying sorting flags, we still want the sorting arrows to honor those flags.
        if (table->Flags & ImGuiTableFlags_Sortable)
            TableFixColumnSortDirection(column);

        // Calculate "ideal" column width for nothing to be clipped.
        // Combine width from regular rows + width from headers unless requested not to.
        const float column_content_width_rows = (float)ImMax(column->ContentWidthRowsFrozen, column->ContentWidthRowsUnfrozen);
        const float column_content_width_headers = (float)column->ContentWidthHeadersIdeal;
        float column_width_ideal = column_content_width_rows;
        if (!(table->Flags & ImGuiTableFlags_NoHeadersWidth) && !(column->Flags & ImGuiTableColumnFlags_NoHeaderWidth))
            column_width_ideal = ImMax(column_width_ideal, column_content_width_headers);
        column_width_ideal = ImMax(column_width_ideal + padding_auto_x, min_column_width);

        // Non-resizable columns also submit their requested width
        if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
            if (column->WidthOrWeightInitValue > 0.0f)
                if (!(table->Flags & ImGuiTableFlags_Resizable) || !(column->Flags & ImGuiTableColumnFlags_NoResize))
                    column_width_ideal = ImMax(column_width_ideal, column->WidthOrWeightInitValue);

        // CellSpacingX is >0.0f when there's no vertical border
        table->ColumnsAutoFitWidth += column_width_ideal;
        if (column->PrevVisibleColumn != -1)
            table->ColumnsAutoFitWidth += table->CellSpacingX;

        if (column->Flags & (ImGuiTableColumnFlags_WidthAlwaysAutoResize | ImGuiTableColumnFlags_WidthFixed))
        {
            // Latch initial size for fixed columns
//            count_fixed += 1;   -- set but never used
            const bool auto_fit = (column->AutoFitQueue != 0x00) || (column->Flags & ImGuiTableColumnFlags_WidthAlwaysAutoResize);
            if (auto_fit)
            {
                column->WidthRequest = column_width_ideal;

                // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
                // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
                // large height (= first frame scrollbar display very off + clipper would skip lots of items).
                // This is merely making the side-effect less extreme, but doesn't properly fixes it.
                // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
                if (column->AutoFitQueue > 0x01 && table->IsInitializing)
                    column->WidthRequest = ImMax(column->WidthRequest, min_column_width * 4.0f);
            }
            sum_width_fixed_requests += column->WidthRequest;
        }
        else
        {
            IM_ASSERT(column->Flags & ImGuiTableColumnFlags_WidthStretch);
            const int init_size = (column->WidthStretchWeight < 0.0f);
            if (init_size)
                column->WidthStretchWeight = 1.0f;
            sum_weights_stretched += column->WidthStretchWeight;
            if (table->LeftMostStretchedColumnDisplayOrder == -1)
                table->LeftMostStretchedColumnDisplayOrder = (ImS8)column->DisplayOrder;
        }
    }

    // Layout
    const float width_spacings = table->CellSpacingX * (table->ColumnsVisibleCount - 1);
    float width_avail;
    if ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f)
        width_avail = table->InnerClipRect.GetWidth() - width_spacings;
    else
        width_avail = work_rect.GetWidth() - width_spacings;
    const float width_avail_for_stretched_columns = width_avail - sum_width_fixed_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;

    // Apply final width based on requested widths
    // Mark some columns as not resizable
    int count_resizable = 0;
    table->ColumnsTotalWidth = width_spacings;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];

        // Allocate width for stretched/weighted columns
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            // WidthStretchWeight gets converted into WidthRequest
            float weight_ratio = column->WidthStretchWeight / sum_weights_stretched;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, min_column_width) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;

            // [Resize Rule 2] Resizing from right-side of a stretch column preceding a fixed column
            // needs to forward resizing to left-side of fixed column. We also need to copy the NoResize flag..
            if (column->NextVisibleColumn != -1)
                if (ImGuiTableColumn* next_column = &table->Columns[column->NextVisibleColumn])
                    if (next_column->Flags & ImGuiTableColumnFlags_WidthFixed)
                        column->Flags |= (next_column->Flags & ImGuiTableColumnFlags_NoDirectResize_);
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // (see comments in TableResizeColumn())
        if (column->NextVisibleColumn == -1 && table->LeftMostStretchedColumnDisplayOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        if (!(column->Flags & ImGuiTableColumnFlags_NoResize))
            count_resizable++;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, min_column_width));
        table->ColumnsTotalWidth += column->WidthGiven;
    }

#if 0
    const float width_excess = table->ColumnsTotalWidth - work_rect.GetWidth();
    if ((table->Flags & ImGuiTableFlags_SizingPolicyStretchX) && width_excess > 0.0f)
    {
        // Shrink widths when the total does not fit
        // FIXME-TABLE: This is working but confuses/conflicts with manual resizing.
        // FIXME-TABLE: Policy to shrink down below below ideal/requested width if there's no room?
        g.ShrinkWidthBuffer.resize(table->ColumnsVisibleCount);
        for (int order_n = 0, visible_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            const int column_n = table->DisplayOrder[order_n];
            g.ShrinkWidthBuffer[visible_n].Index = column_n;
            g.ShrinkWidthBuffer[visible_n].Width = table->Columns[column_n].WidthGiven;
            visible_n++;
        }
        ShrinkWidths(g.ShrinkWidthBuffer.Data, g.ShrinkWidthBuffer.Size, width_excess);
        for (int n = 0; n < g.ShrinkWidthBuffer.Size; n++)
            table->Columns[g.ShrinkWidthBuffer.Data[n].Index].WidthGiven = ImMax(g.ShrinkWidthBuffer.Data[n].Width, min_column_size);
        // FIXME: Need to alter table->ColumnsTotalWidth
    }
    else
#endif

    // Redistribute remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor), could be adjusted depending
    // on where the mouse cursor is and/or relative weights.
    // FIXME-TABLE: May be simpler to store floating width and floor final positions only
    // FIXME-TABLE: Make it optional? User might prefer to preserve pixel perfect same size?
    if (width_remaining_for_stretched_columns >= 1.0f)
        for (int order_n = table->ColumnsCount - 1; sum_weights_stretched > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    // Detect hovered column
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // Setup final position, offset and clipping rectangles
    int visible_n = 0;
    float offset_x = (table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x;
    ImRect host_clip_rect = table->InnerClipRect;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        if (table->FreezeColumnsCount > 0 && table->FreezeColumnsCount == visible_n)
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;

        if ((table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = offset_x;
            column->StartXRows = column->StartXHeaders = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.x = offset_x;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.x = offset_x;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsClipped = column->SkipItems = true;
            continue;
        }

        float max_x = FLT_MAX;
        if (table->Flags & ImGuiTableFlags_ScrollX)
        {
            // Frozen columns can't reach beyond visible width else scrolling will naturally break.
            if (order_n < table->FreezeColumnsRequest)
                max_x = table->InnerClipRect.Max.x - (table->FreezeColumnsRequest - order_n) * min_column_width;
        }
        else
        {
            // If horizontal scrolling if disabled, we apply a final lossless shrinking of columns in order to make
            // sure they are all visible. Because of this we also know that all of the columns will always fit in
            // table->WorkRect and therefore in table->InnerRect (because ScrollX is off)
            if (!(table->Flags & ImGuiTableFlags_NoKeepColumnsVisible))
                max_x = table->WorkRect.Max.x - (table->ColumnsVisibleCount - (column->IndexWithinVisibleSet + 1)) * min_column_width;
        }
        if (offset_x + column->WidthGiven > max_x)
            column->WidthGiven = ImMax(max_x - offset_x, min_column_width);

        column->MinX = offset_x;
        column->MaxX = column->MinX + column->WidthGiven;

        //// A one pixel padding on the right side makes clipping more noticeable and contents look less cramped.
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX;// -1.0f;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        column->IsClipped = (column->ClipRect.Max.x <= column->ClipRect.Min.x) && (column->AutoFitQueue & 1) == 0 && (column->CannotSkipItemsQueue & 1) == 0;
        if (column->IsClipped)
            table->VisibleUnclippedMaskByIndex &= ~((ImU64)1 << column_n);  // Columns with the _WidthAlwaysAutoResize sizing policy will never be updated then.

        column->SkipItems = !column->IsVisible || table->HostSkipItems;

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImS8)column_n;

        // Starting cursor position
        column->StartXRows = column->StartXHeaders = column->MinX + table->CellPaddingX1;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->StartXRows = ImMax(column->StartXRows, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->StartXRows = ImLerp(column->StartXRows, ImMax(column->StartXRows, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        const float initial_max_pos_x = column->MinX + table->CellPaddingX1;
        column->ContentMaxPosRowsFrozen = column->ContentMaxPosRowsUnfrozen = initial_max_pos_x;
        column->ContentMaxPosHeadersUsed = column->ContentMaxPosHeadersIdeal = initial_max_pos_x;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImMax(host_clip_rect.Min.x, column->MaxX + 2.0f);

        offset_x += column->WidthGiven + table->CellSpacingX;
        visible_n++;
    }

    // Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        float unused_x1 = table->WorkRect.Min.x;
        if (table->RightMostVisibleColumn != -1)
            unused_x1 = ImMax(unused_x1, table->Columns[table->RightMostVisibleColumn].ClipRect.Max.x);
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImS8)table->ColumnsCount;
    }

    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag,
    // either because of using _WidthAlwaysAutoResize/_WidthStretch).
    // This will hide the resizing option from the context menu.
    if (count_resizable == 0 && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // Allocate draw channels
    TableUpdateDrawChannels(table);

    // Borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);

    // Reset fields after we used them in TableSetupResize()
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClipX)
        table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, 1);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);

    // Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);
}